

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void write_access_unit_delimiter_rbsp(h264_stream_t *h,bs_t *b)

{
  bs_t *b_local;
  h264_stream_t *h_local;
  
  bs_write_u(b,3,h->aud->primary_pic_type);
  return;
}

Assistant:

void write_access_unit_delimiter_rbsp(h264_stream_t* h, bs_t* b)
{
    bs_write_u(b, 3, h->aud->primary_pic_type);
}